

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_lib.cc
# Opt level: O2

void ASN1_put_object(uchar **pp,int constructed,int length,int tag,int xclass)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  
  pbVar2 = *pp;
  bVar1 = (byte)xclass & 0xc0 | (constructed != 0) << 5;
  if (tag < 0x1f) {
    *pbVar2 = bVar1 | (byte)tag & 0x1f;
    pbVar2 = pbVar2 + 1;
  }
  else {
    *pbVar2 = bVar1 | 0x1f;
    lVar4 = 0;
    for (uVar5 = tag; 0 < (int)uVar5; uVar5 = uVar5 >> 7) {
      lVar4 = lVar4 + 1;
    }
    lVar6 = 0;
    for (lVar7 = lVar4; 0 < lVar7; lVar7 = lVar7 + -1) {
      pbVar2[lVar7] = (lVar6 != 0) << 7 | (byte)tag & 0x7f;
      tag = (uint)tag >> 7;
      lVar6 = lVar6 + 1;
    }
    pbVar2 = pbVar2 + lVar4 + 1;
  }
  if (constructed == 2) {
    *pbVar2 = 0x80;
  }
  else {
    if (0x7f < length) {
      lVar4 = 0;
      pbVar3 = pbVar2;
      for (uVar5 = length; pbVar3 = pbVar3 + 1, uVar5 != 0; uVar5 = uVar5 >> 8) {
        lVar4 = lVar4 + 1;
      }
      *pbVar2 = (byte)lVar4 | 0x80;
      for (; 0 < lVar4; lVar4 = lVar4 + -1) {
        pbVar2[lVar4] = (byte)length;
        length = (uint)length >> 8;
      }
      goto LAB_003cb012;
    }
    *pbVar2 = (byte)length;
  }
  pbVar3 = pbVar2 + 1;
LAB_003cb012:
  *pp = pbVar3;
  return;
}

Assistant:

void ASN1_put_object(unsigned char **pp, int constructed, int length, int tag,
                     int xclass) {
  unsigned char *p = *pp;
  int i, ttag;

  i = (constructed) ? V_ASN1_CONSTRUCTED : 0;
  i |= (xclass & V_ASN1_PRIVATE);
  if (tag < 31) {
    *(p++) = i | (tag & V_ASN1_PRIMITIVE_TAG);
  } else {
    *(p++) = i | V_ASN1_PRIMITIVE_TAG;
    for (i = 0, ttag = tag; ttag > 0; i++) {
      ttag >>= 7;
    }
    ttag = i;
    while (i-- > 0) {
      p[i] = tag & 0x7f;
      if (i != (ttag - 1)) {
        p[i] |= 0x80;
      }
      tag >>= 7;
    }
    p += ttag;
  }
  if (constructed == 2) {
    *(p++) = 0x80;
  } else {
    asn1_put_length(&p, length);
  }
  *pp = p;
}